

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O0

ExceptionInfoResponse * __thiscall
cmDebugger::cmDebuggerExceptionManager::HandleExceptionInfoRequest
          (ExceptionInfoResponse *__return_storage_ptr__,cmDebuggerExceptionManager *this)

{
  bool bVar1;
  cmDebuggerException *pcVar2;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  cmDebuggerExceptionManager *this_local;
  ExceptionInfoResponse *response;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->Mutex);
  dap::ExceptionInfoResponse::ExceptionInfoResponse(__return_storage_ptr__);
  bVar1 = std::optional<cmDebugger::cmDebuggerException>::has_value(&this->TheException);
  if (bVar1) {
    pcVar2 = std::optional<cmDebugger::cmDebuggerException>::operator->(&this->TheException);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->exceptionId,(string *)pcVar2)
    ;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"always");
    pcVar2 = std::optional<cmDebugger::cmDebuggerException>::operator->(&this->TheException);
    dap::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&__return_storage_ptr__->description,
               &pcVar2->Description);
    std::optional<cmDebugger::cmDebuggerException>::operator=(&this->TheException);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

dap::ExceptionInfoResponse
cmDebuggerExceptionManager::HandleExceptionInfoRequest()
{
  std::unique_lock<std::mutex> lock(Mutex);

  dap::ExceptionInfoResponse response;
  if (TheException.has_value()) {
    response.exceptionId = TheException->Id;
    response.breakMode = "always";
    response.description = TheException->Description;
    TheException = cm::nullopt;
  }
  return response;
}